

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

bool __thiscall smf::MidiMessage::isSustainOn(MidiMessage *this)

{
  bool bVar1;
  int iVar2;
  MidiMessage *this_local;
  
  bVar1 = isSustain(this);
  if (bVar1) {
    iVar2 = getP2(this);
    if (iVar2 < 0x40) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MidiMessage::isSustainOn(void) const {
	if (!isSustain()) {
		return false;
	}
	if (getP2() >= 64) {
		return true;
	} else {
		return false;
	}
}